

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O3

int mk_vhost_get(mk_ptr_t host,mk_vhost **vhost,mk_vhost_alias **alias,mk_server *server)

{
  mk_list *pmVar1;
  int iVar2;
  mk_list *pmVar3;
  
  pmVar1 = (server->hosts).next;
  do {
    if (pmVar1 == &server->hosts) {
      return -1;
    }
    for (pmVar3 = pmVar1[-5].prev; pmVar3 != (mk_list *)&pmVar1[-6].next; pmVar3 = pmVar3->next) {
      if (((ulong)*(uint *)&pmVar3[-1].next == host.len) &&
         (iVar2 = strncmp((char *)pmVar3[-1].prev,host.data,host.len), iVar2 == 0)) {
        *vhost = (mk_vhost *)&pmVar1[-7].next;
        *alias = (mk_vhost_alias *)(pmVar3 + -1);
        return 0;
      }
    }
    pmVar1 = pmVar1->next;
  } while( true );
}

Assistant:

int mk_vhost_get(mk_ptr_t host, struct mk_vhost **vhost,
                 struct mk_vhost_alias **alias,
                 struct mk_server *server)
{
    struct mk_vhost *entry_host;
    struct mk_vhost_alias *entry_alias;
    struct mk_list *head_vhost, *head_alias;

    mk_list_foreach(head_vhost, &server->hosts) {
        entry_host = mk_list_entry(head_vhost, struct mk_vhost, _head);
        mk_list_foreach(head_alias, &entry_host->server_names) {
            entry_alias = mk_list_entry(head_alias, struct mk_vhost_alias, _head);
            if (entry_alias->len == host.len &&
                strncmp(entry_alias->name, host.data, host.len) == 0) {
                *vhost = entry_host;
                *alias = entry_alias;
                return 0;
            }
        }
    }

    return -1;
}